

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang_bis.c
# Opt level: O0

void yyerror(YYLTYPE *yylloc,void *scanner,yang_parameter *param,...)

{
  ly_ctx *plVar1;
  void *elem;
  char *pcVar2;
  yang_parameter *param_local;
  void *scanner_local;
  YYLTYPE *yylloc_local;
  
  free(*param->value);
  *param->value = (char *)0x0;
  if (yylloc->first_line != -1) {
    if ((*param->data_node == (void *)0x0) || (*param->data_node != *param->actual_node)) {
      plVar1 = param->module->ctx;
      pcVar2 = yyget_text(scanner);
      ly_vlog(plVar1,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar2);
    }
    else {
      plVar1 = param->module->ctx;
      elem = *param->data_node;
      pcVar2 = yyget_text(scanner);
      ly_vlog(plVar1,LYE_INSTMT,LY_VLOG_LYS,elem,pcVar2);
    }
  }
  return;
}

Assistant:

void
yyerror(YYLTYPE *yylloc, void *scanner, struct yang_parameter *param, ...)
{
  free(*param->value);
  *param->value = NULL;
  if (yylloc->first_line != -1) {
    if (*param->data_node && (*param->data_node) == (*param->actual_node)) {
      LOGVAL(param->module->ctx, LYE_INSTMT, LY_VLOG_LYS, *param->data_node, yyget_text(scanner));
    } else {
      LOGVAL(param->module->ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, yyget_text(scanner));
    }
  }
}